

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> __thiscall
wallet::DescriptorScriptPubKeyMan::GetSigningProvider
          (DescriptorScriptPubKeyMan *this,CPubKey *pubkey)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RSI;
  tuple<FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_> in_RDI;
  long in_FS_OFFSET;
  bool in_stack_00000017;
  DescriptorScriptPubKeyMan *in_stack_00000018;
  int32_t index;
  int32_t in_stack_0000005c;
  const_iterator it;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock69;
  key_type *in_stack_ffffffffffffff78;
  map<CPubKey,_int,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>
  *in_stack_ffffffffffffff80;
  _Head_base<0UL,_FlatSigningProvider_*,_false> __x;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __x._M_head_impl =
       (FlatSigningProvider *)
       in_RDI.
       super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>.
       super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff78);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffffb8,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffa0,(int)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
  std::map<CPubKey,_int,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>::find
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::map<CPubKey,_int,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>::end
            (in_stack_ffffffffffffff80);
  bVar2 = std::operator==((_Self *)__x._M_head_impl,(_Self *)in_stack_ffffffffffffff80);
  if (bVar2) {
    std::unique_ptr<FlatSigningProvider,std::default_delete<FlatSigningProvider>>::
    unique_ptr<std::default_delete<FlatSigningProvider>,void>
              ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)
               in_stack_ffffffffffffff78,(nullptr_t)0x4061b2);
  }
  else {
    std::_Rb_tree_const_iterator<std::pair<const_CPubKey,_int>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_CPubKey,_int>_> *)in_stack_ffffffffffffff78)
    ;
    GetSigningProvider(in_stack_00000018,in_stack_0000005c,in_stack_00000017);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<FlatSigningProvider,_std::default_delete<FlatSigningProvider>,_true,_true>
            )(__uniq_ptr_data<FlatSigningProvider,_std::default_delete<FlatSigningProvider>,_true,_true>
              )in_RDI.
               super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>
               .super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<FlatSigningProvider> DescriptorScriptPubKeyMan::GetSigningProvider(const CPubKey& pubkey) const
{
    LOCK(cs_desc_man);

    // Find index of the pubkey
    auto it = m_map_pubkeys.find(pubkey);
    if (it == m_map_pubkeys.end()) {
        return nullptr;
    }
    int32_t index = it->second;

    // Always try to get the signing provider with private keys. This function should only be called during signing anyways
    return GetSigningProvider(index, true);
}